

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O1

void __thiscall ControlParser::parseLinkSetting(ControlParser *this,Network *network)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  InputError *pIVar3;
  char *__to;
  string local_f0;
  string local_d0;
  string local_b0;
  size_type *local_90;
  string id;
  string settingStr;
  undefined1 local_40 [16];
  
  id._M_dataplus._M_p = (pointer)0x0;
  id._M_string_length._0_1_ = 0;
  local_90 = &id._M_string_length;
  std::operator>>((istream *)this,(string *)&local_90);
  iVar2 = Network::link(network,(char *)&local_90,__to);
  this->link = (Link *)CONCAT44(extraout_var,iVar2);
  if ((Link *)CONCAT44(extraout_var,iVar2) == (Link *)0x0) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_90,id._M_dataplus._M_p + (long)local_90);
    InputError::InputError(pIVar3,5,&local_f0);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    InputError::InputError(pIVar3,2,&local_d0);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  settingStr._M_dataplus._M_p = (pointer)0x0;
  settingStr._M_string_length._0_1_ = 0;
  id.field_2._8_8_ = &settingStr._M_string_length;
  std::operator>>((istream *)this,(string *)(id.field_2._M_local_buf + 8));
  settingStr.field_2._8_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&settingStr.field_2 + 8),"OPEN","");
  bVar1 = Utilities::match((string *)((long)&id.field_2 + 8),
                           (string *)((long)&settingStr.field_2 + 8));
  if ((undefined1 *)settingStr.field_2._8_8_ != local_40) {
    operator_delete((void *)settingStr.field_2._8_8_);
  }
  iVar2 = 1;
  if (!bVar1) {
    settingStr.field_2._8_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&settingStr.field_2 + 8),"CLOSED","");
    bVar1 = Utilities::match((string *)((long)&id.field_2 + 8),
                             (string *)((long)&settingStr.field_2 + 8));
    if ((undefined1 *)settingStr.field_2._8_8_ != local_40) {
      operator_delete((void *)settingStr.field_2._8_8_);
    }
    iVar2 = 0;
    if (!bVar1) {
      bVar1 = Utilities::parseNumber<double>((string *)((long)&id.field_2 + 8),&this->linkSetting);
      if (!bVar1) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,id.field_2._8_8_,
                   settingStr._M_dataplus._M_p + id.field_2._8_8_);
        InputError::InputError(pIVar3,6,&local_b0);
        __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
      }
      goto LAB_0013055d;
    }
  }
  this->linkStatus = iVar2;
LAB_0013055d:
  if ((size_type *)id.field_2._8_8_ != &settingStr._M_string_length) {
    operator_delete((void *)id.field_2._8_8_);
  }
  if (local_90 != &id._M_string_length) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void ControlParser::parseLinkSetting(Network* network)
{
    //... read id of link being controlled
    string id;
    sin >> id;
    link = network->link(id);
    if (link == nullptr) throw InputError(InputError::UNDEFINED_OBJECT, id);

    //... read control setting/status as a string
    if ( sin.eof() ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string settingStr;
    sin >> settingStr;

    //... convert string to status or to numerical value
    if ( Utilities::match(settingStr, w_OPEN) )
    {
        linkStatus = Control::OPEN_STATUS;
    }
    else if ( Utilities::match(settingStr, w_CLOSED) )
    {
        linkStatus = Control::CLOSED_STATUS;
    }
    else if ( !Utilities::parseNumber(settingStr, linkSetting) )
    {
        throw InputError(InputError::INVALID_NUMBER, settingStr);
    }
}